

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  float fVar3;
  float fVar4;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  size_t k;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  uint uVar35;
  undefined4 uVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  NodeRef *pNVar45;
  bool bVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar59;
  float fVar61;
  float fVar62;
  undefined1 in_ZMM0 [64];
  undefined1 auVar60 [64];
  float fVar64;
  vint4 ai_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  vint4 bi_3;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar108;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar104 [16];
  float fVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar118;
  float fVar119;
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar121;
  float fVar126;
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar130;
  float fVar131;
  float fVar134;
  float fVar136;
  vint4 ai_1;
  undefined1 auVar132 [16];
  float fVar135;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  vint4 ai_3;
  undefined1 auVar142 [16];
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  undefined1 auVar146 [64];
  undefined1 auVar153 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar165;
  float fVar166;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  Precalculations pre;
  undefined1 local_19a8 [16];
  undefined1 local_1998 [8];
  float fStack_1990;
  float fStack_198c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  RTCHitN local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  uint local_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  uint uStack_1838;
  uint uStack_1834;
  uint uStack_1830;
  uint uStack_182c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar34 = mm_lookupmask_ps._248_8_;
  uVar33 = mm_lookupmask_ps._240_8_;
  uVar32 = mm_lookupmask_ps._8_8_;
  uVar31 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar94 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar50 = vpcmpeqd_avx(auVar94,(undefined1  [16])valid_i->field_0);
    auVar83 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar83,5);
    auVar99 = auVar50 & auVar8;
    if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar99[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar50);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar138._8_4_ = 0x7fffffff;
      auVar138._0_8_ = 0x7fffffff7fffffff;
      auVar138._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar122._8_4_ = 0x219392ef;
      auVar122._0_8_ = 0x219392ef219392ef;
      auVar122._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar122,1);
      auVar99 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar122,auVar50)
      ;
      auVar50 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar122,1);
      auVar58 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar122,auVar50)
      ;
      auVar50 = vandps_avx(auVar138,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar122,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar122,auVar50)
      ;
      auVar57 = vrcpps_avx(auVar99);
      fVar61 = auVar57._0_4_;
      auVar95._0_4_ = auVar99._0_4_ * fVar61;
      fVar62 = auVar57._4_4_;
      auVar95._4_4_ = auVar99._4_4_ * fVar62;
      fVar63 = auVar57._8_4_;
      auVar95._8_4_ = auVar99._8_4_ * fVar63;
      fVar129 = auVar57._12_4_;
      auVar95._12_4_ = auVar99._12_4_ * fVar129;
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = 0x3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar99 = vsubps_avx(auVar123,auVar95);
      tray.rdir.field_0._0_4_ = fVar61 + fVar61 * auVar99._0_4_;
      tray.rdir.field_0._4_4_ = fVar62 + fVar62 * auVar99._4_4_;
      tray.rdir.field_0._8_4_ = fVar63 + fVar63 * auVar99._8_4_;
      tray.rdir.field_0._12_4_ = fVar129 + fVar129 * auVar99._12_4_;
      auVar99 = vrcpps_avx(auVar58);
      fVar61 = auVar99._0_4_;
      auVar57._0_4_ = auVar58._0_4_ * fVar61;
      fVar62 = auVar99._4_4_;
      auVar57._4_4_ = auVar58._4_4_ * fVar62;
      fVar63 = auVar99._8_4_;
      auVar57._8_4_ = auVar58._8_4_ * fVar63;
      fVar129 = auVar99._12_4_;
      auVar57._12_4_ = auVar58._12_4_ * fVar129;
      auVar99 = vsubps_avx(auVar123,auVar57);
      tray.rdir.field_0._16_4_ = fVar61 + fVar61 * auVar99._0_4_;
      tray.rdir.field_0._20_4_ = fVar62 + fVar62 * auVar99._4_4_;
      tray.rdir.field_0._24_4_ = fVar63 + fVar63 * auVar99._8_4_;
      tray.rdir.field_0._28_4_ = fVar129 + fVar129 * auVar99._12_4_;
      auVar99 = vrcpps_avx(auVar50);
      fVar61 = auVar99._0_4_;
      auVar58._0_4_ = auVar50._0_4_ * fVar61;
      fVar62 = auVar99._4_4_;
      auVar58._4_4_ = auVar50._4_4_ * fVar62;
      fVar63 = auVar99._8_4_;
      auVar58._8_4_ = auVar50._8_4_ * fVar63;
      fVar129 = auVar99._12_4_;
      auVar58._12_4_ = auVar50._12_4_ * fVar129;
      auVar50 = vsubps_avx(auVar123,auVar58);
      tray.rdir.field_0._32_4_ = fVar61 + fVar61 * auVar50._0_4_;
      tray.rdir.field_0._36_4_ = fVar62 + fVar62 * auVar50._4_4_;
      tray.rdir.field_0._40_4_ = fVar63 + fVar63 * auVar50._8_4_;
      tray.rdir.field_0._44_4_ = fVar129 + fVar129 * auVar50._12_4_;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar83,1);
      auVar112._8_4_ = 0x10;
      auVar112._0_8_ = 0x1000000010;
      auVar112._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar112);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar83,5);
      auVar99._8_4_ = 0x20;
      auVar99._0_8_ = 0x2000000020;
      auVar99._12_4_ = 0x20;
      auVar113._8_4_ = 0x30;
      auVar113._0_8_ = 0x3000000030;
      auVar113._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar113,auVar99,auVar50)
      ;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar83,5);
      auVar104._8_4_ = 0x40;
      auVar104._0_8_ = 0x4000000040;
      auVar104._12_4_ = 0x40;
      auVar114._8_4_ = 0x50;
      auVar114._0_8_ = 0x5000000050;
      auVar114._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar114,auVar104,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar83);
      auVar99 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar83);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar146 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,auVar8);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar99,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar94._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar94._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar94._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar94._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar43 = 3;
      }
      else {
        uVar43 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar44 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar94 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
      auVar154 = ZEXT1664(auVar94);
LAB_002f7c8d:
      do {
        do {
          root.ptr = pNVar45[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_002f8bdc;
          pNVar45 = pNVar45 + -1;
          paVar44 = paVar44 + -1;
          aVar71 = *paVar44;
          auVar94 = vcmpps_avx((undefined1  [16])aVar71,(undefined1  [16])tray.tfar.field_0,1);
          uVar35 = vmovmskps_avx(auVar94);
        } while (uVar35 == 0);
        uVar41 = (ulong)(uVar35 & 0xff);
        uVar35 = POPCOUNT(uVar35 & 0xff);
        if (uVar43 < uVar35) {
LAB_002f7ccb:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002f8bdc;
              auVar94 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar71,6);
              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar94[0xf]) goto LAB_002f7c8d;
              uVar41 = (ulong)((uint)root.ptr & 0xf);
              aVar59 = terminated.field_0;
              if (uVar41 == 8) goto LAB_002f8ac6;
              lVar39 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar42 = 0;
              auVar94 = auVar154._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_002f7ea3;
            }
            lVar39 = 0;
            uVar41 = 8;
            aVar71 = auVar146._0_16_;
            do {
              uVar42 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar39 * 8);
              if (uVar42 == 8) break;
              uVar36 = *(undefined4 *)(root.ptr + 0x20 + lVar39 * 4);
              auVar65._4_4_ = uVar36;
              auVar65._0_4_ = uVar36;
              auVar65._8_4_ = uVar36;
              auVar65._12_4_ = uVar36;
              auVar83._8_8_ = tray.org.field_0._8_8_;
              auVar83._0_8_ = tray.org.field_0._0_8_;
              auVar23._8_8_ = tray.org.field_0._24_8_;
              auVar23._0_8_ = tray.org.field_0._16_8_;
              auVar24._8_8_ = tray.org.field_0._40_8_;
              auVar24._0_8_ = tray.org.field_0._32_8_;
              auVar94 = vsubps_avx(auVar65,auVar83);
              auVar115._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar94._0_4_;
              auVar115._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar94._4_4_;
              auVar115._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar94._8_4_;
              auVar115._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar94._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x40 + lVar39 * 4);
              auVar66._4_4_ = uVar36;
              auVar66._0_4_ = uVar36;
              auVar66._8_4_ = uVar36;
              auVar66._12_4_ = uVar36;
              auVar94 = vsubps_avx(auVar66,auVar23);
              auVar132._0_4_ = tray.rdir.field_0._16_4_ * auVar94._0_4_;
              auVar132._4_4_ = tray.rdir.field_0._20_4_ * auVar94._4_4_;
              auVar132._8_4_ = tray.rdir.field_0._24_4_ * auVar94._8_4_;
              auVar132._12_4_ = tray.rdir.field_0._28_4_ * auVar94._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x60 + lVar39 * 4);
              auVar67._4_4_ = uVar36;
              auVar67._0_4_ = uVar36;
              auVar67._8_4_ = uVar36;
              auVar67._12_4_ = uVar36;
              auVar94 = vsubps_avx(auVar67,auVar24);
              auVar142._0_4_ = tray.rdir.field_0._32_4_ * auVar94._0_4_;
              auVar142._4_4_ = tray.rdir.field_0._36_4_ * auVar94._4_4_;
              auVar142._8_4_ = tray.rdir.field_0._40_4_ * auVar94._8_4_;
              auVar142._12_4_ = tray.rdir.field_0._44_4_ * auVar94._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x30 + lVar39 * 4);
              auVar68._4_4_ = uVar36;
              auVar68._0_4_ = uVar36;
              auVar68._8_4_ = uVar36;
              auVar68._12_4_ = uVar36;
              auVar94 = vsubps_avx(auVar68,auVar83);
              auVar85._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar94._0_4_;
              auVar85._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar94._4_4_;
              auVar85._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar94._8_4_;
              auVar85._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar94._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x50 + lVar39 * 4);
              auVar69._4_4_ = uVar36;
              auVar69._0_4_ = uVar36;
              auVar69._8_4_ = uVar36;
              auVar69._12_4_ = uVar36;
              auVar94 = vsubps_avx(auVar69,auVar23);
              auVar96._0_4_ = tray.rdir.field_0._16_4_ * auVar94._0_4_;
              auVar96._4_4_ = tray.rdir.field_0._20_4_ * auVar94._4_4_;
              auVar96._8_4_ = tray.rdir.field_0._24_4_ * auVar94._8_4_;
              auVar96._12_4_ = tray.rdir.field_0._28_4_ * auVar94._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x70 + lVar39 * 4);
              auVar70._4_4_ = uVar36;
              auVar70._0_4_ = uVar36;
              auVar70._8_4_ = uVar36;
              auVar70._12_4_ = uVar36;
              auVar94 = vsubps_avx(auVar70,auVar24);
              auVar100._0_4_ = tray.rdir.field_0._32_4_ * auVar94._0_4_;
              auVar100._4_4_ = tray.rdir.field_0._36_4_ * auVar94._4_4_;
              auVar100._8_4_ = tray.rdir.field_0._40_4_ * auVar94._8_4_;
              auVar100._12_4_ = tray.rdir.field_0._44_4_ * auVar94._12_4_;
              auVar94 = vpminsd_avx(auVar115,auVar85);
              auVar50 = vpminsd_avx(auVar132,auVar96);
              auVar94 = vpmaxsd_avx(auVar94,auVar50);
              auVar50 = vpminsd_avx(auVar142,auVar100);
              auVar50 = vpmaxsd_avx(auVar94,auVar50);
              auVar94 = vpmaxsd_avx(auVar115,auVar85);
              auVar99 = vpmaxsd_avx(auVar132,auVar96);
              auVar99 = vpminsd_avx(auVar94,auVar99);
              auVar94 = vpmaxsd_avx(auVar142,auVar100);
              auVar99 = vpminsd_avx(auVar99,auVar94);
              auVar94 = vpmaxsd_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
              auVar99 = vpminsd_avx(auVar99,(undefined1  [16])tray.tfar.field_0);
              auVar94 = vcmpps_avx(auVar94,auVar99,2);
              uVar40 = uVar41;
              aVar7 = aVar71;
              if (((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar94[0xf] < '\0') &&
                 (aVar7.v = (__m128)vblendvps_avx(auVar146._0_16_,auVar50,auVar94), uVar40 = uVar42,
                 uVar41 != 8)) {
                pNVar45->ptr = uVar41;
                pNVar45 = pNVar45 + 1;
                *paVar44 = aVar71;
                paVar44 = paVar44 + 1;
              }
              aVar71 = aVar7;
              uVar41 = uVar40;
              lVar39 = lVar39 + 1;
            } while (lVar39 != 4);
            if (uVar41 == 8) goto LAB_002f8ab1;
            auVar94 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar71,6);
            uVar36 = vmovmskps_avx(auVar94);
            root.ptr = uVar41;
          } while ((byte)uVar43 < (byte)POPCOUNT(uVar36));
          pNVar45->ptr = uVar41;
          pNVar45 = pNVar45 + 1;
          *paVar44 = aVar71;
          paVar44 = paVar44 + 1;
LAB_002f8ab1:
          iVar37 = 4;
        }
        else {
          do {
            k = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar154 = ZEXT1664(auVar154._0_16_);
            bVar46 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar46) {
              terminated.field_0.i[k] = -1;
            }
            uVar41 = uVar41 & uVar41 - 1;
          } while (uVar41 != 0);
          auVar94 = vpcmpeqd_avx(auVar154._0_16_,auVar154._0_16_);
          auVar154 = ZEXT1664(auVar94);
          auVar94 = auVar94 & ~(undefined1  [16])terminated.field_0;
          iVar37 = 3;
          if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar94[0xf] < '\0') {
            auVar94._8_4_ = 0xff800000;
            auVar94._0_8_ = 0xff800000ff800000;
            auVar94._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar94,
                               (undefined1  [16])terminated.field_0);
            iVar37 = 2;
          }
          auVar146 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar43 < uVar35) goto LAB_002f7ccb;
        }
      } while (iVar37 != 3);
LAB_002f8bdc:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar84._8_4_ = 0xff800000;
      auVar84._0_8_ = 0xff800000ff800000;
      auVar84._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar84);
      *(undefined1 (*) [16])pRVar1 = auVar8;
    }
  }
  return;
  while( true ) {
    uVar42 = uVar42 + 1;
    lVar39 = lVar39 + 0xe0;
    auVar94 = auVar99;
    if (uVar41 - 8 <= uVar42) break;
LAB_002f7ea3:
    lVar38 = uVar42 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar60 = ZEXT1664(auVar94);
    uVar40 = 0;
    while( true ) {
      auVar50 = auVar60._0_16_;
      uVar35 = *(uint *)(lVar39 + uVar40 * 4);
      if ((ulong)uVar35 == 0xffffffff) break;
      fVar61 = *(float *)(lVar39 + -0xc0 + uVar40 * 4);
      auVar48._4_4_ = fVar61;
      auVar48._0_4_ = fVar61;
      auVar48._8_4_ = fVar61;
      auVar48._12_4_ = fVar61;
      fVar62 = *(float *)(lVar39 + -0xb0 + uVar40 * 4);
      auVar72._4_4_ = fVar62;
      auVar72._0_4_ = fVar62;
      auVar72._8_4_ = fVar62;
      auVar72._12_4_ = fVar62;
      fVar63 = *(float *)(lVar39 + -0xa0 + uVar40 * 4);
      auVar86._4_4_ = fVar63;
      auVar86._0_4_ = fVar63;
      auVar86._8_4_ = fVar63;
      auVar86._12_4_ = fVar63;
      local_1998._4_4_ = *(float *)(lVar39 + -0x90 + uVar40 * 4);
      local_1918._4_4_ = *(float *)(lVar39 + -0x80 + uVar40 * 4);
      fVar129 = *(float *)(lVar39 + -0x70 + uVar40 * 4);
      local_1928._4_4_ = *(undefined4 *)(lVar39 + -0x60 + uVar40 * 4);
      local_1928._0_4_ = local_1928._4_4_;
      local_1928._8_4_ = local_1928._4_4_;
      local_1928._12_4_ = local_1928._4_4_;
      local_1938._4_4_ = *(undefined4 *)(lVar39 + -0x50 + uVar40 * 4);
      local_1938._0_4_ = local_1938._4_4_;
      local_1938._8_4_ = local_1938._4_4_;
      local_1938._12_4_ = local_1938._4_4_;
      uVar36 = *(undefined4 *)(lVar39 + -0x40 + uVar40 * 4);
      fVar47 = *(float *)(lVar39 + -0x30 + uVar40 * 4);
      fVar3 = *(float *)(lVar39 + -0x20 + uVar40 * 4);
      fVar4 = *(float *)(lVar39 + -0x10 + uVar40 * 4);
      local_18c8 = *(undefined8 *)(lVar38 + 0xd0);
      uStack_18c0 = *(undefined8 *)(lVar38 + 0xd8);
      local_1918._0_4_ = local_1918._4_4_;
      fStack_1910 = (float)local_1918._4_4_;
      fStack_190c = (float)local_1918._4_4_;
      fVar143 = fVar62 - (float)local_1918._4_4_;
      fVar64 = fVar63 - fVar129;
      fVar62 = fVar3 - fVar62;
      fVar63 = fVar4 - fVar63;
      local_1998._0_4_ = local_1998._4_4_;
      fStack_1990 = (float)local_1998._4_4_;
      fStack_198c = (float)local_1998._4_4_;
      fVar19 = fVar61 - (float)local_1998._4_4_;
      fVar61 = fVar47 - fVar61;
      auVar99 = vsubps_avx(auVar48,*(undefined1 (*) [16])ray);
      auVar83 = vsubps_avx(auVar72,*(undefined1 (*) [16])(ray + 0x10));
      auVar58 = vsubps_avx(auVar86,*(undefined1 (*) [16])(ray + 0x20));
      fVar9 = *(float *)(ray + 0x50);
      fVar10 = *(float *)(ray + 0x54);
      fVar11 = *(float *)(ray + 0x58);
      fVar12 = *(float *)(ray + 0x5c);
      fVar13 = *(float *)(ray + 0x60);
      fVar14 = *(float *)(ray + 100);
      fVar15 = *(float *)(ray + 0x68);
      fVar16 = *(float *)(ray + 0x6c);
      fVar130 = auVar58._0_4_;
      auVar157._0_4_ = fVar130 * fVar9;
      fVar134 = auVar58._4_4_;
      auVar157._4_4_ = fVar134 * fVar10;
      fVar111 = auVar58._8_4_;
      auVar157._8_4_ = fVar111 * fVar11;
      fVar118 = auVar58._12_4_;
      auVar157._12_4_ = fVar118 * fVar12;
      fVar121 = auVar83._0_4_;
      auVar162._0_4_ = fVar121 * fVar13;
      fVar126 = auVar83._4_4_;
      auVar162._4_4_ = fVar126 * fVar14;
      fVar127 = auVar83._8_4_;
      auVar162._8_4_ = fVar127 * fVar15;
      fVar128 = auVar83._12_4_;
      auVar162._12_4_ = fVar128 * fVar16;
      auVar112 = vsubps_avx(auVar162,auVar157);
      fVar17 = *(float *)(ray + 0x40);
      fVar18 = *(float *)(ray + 0x44);
      fVar20 = *(float *)(ray + 0x48);
      fVar21 = *(float *)(ray + 0x4c);
      fVar103 = auVar99._0_4_;
      auVar158._0_4_ = fVar103 * fVar13;
      fVar108 = auVar99._4_4_;
      auVar158._4_4_ = fVar108 * fVar14;
      fVar109 = auVar99._8_4_;
      auVar158._8_4_ = fVar109 * fVar15;
      fVar110 = auVar99._12_4_;
      auVar158._12_4_ = fVar110 * fVar16;
      auVar163._0_4_ = fVar130 * fVar17;
      auVar163._4_4_ = fVar134 * fVar18;
      auVar163._8_4_ = fVar111 * fVar20;
      auVar163._12_4_ = fVar118 * fVar21;
      auVar113 = vsubps_avx(auVar163,auVar158);
      auVar164._0_4_ = fVar121 * fVar17;
      auVar164._4_4_ = fVar126 * fVar18;
      auVar164._8_4_ = fVar127 * fVar20;
      auVar164._12_4_ = fVar128 * fVar21;
      auVar139._0_4_ = fVar103 * fVar9;
      auVar139._4_4_ = fVar108 * fVar10;
      auVar139._8_4_ = fVar109 * fVar11;
      auVar139._12_4_ = fVar110 * fVar12;
      auVar114 = vsubps_avx(auVar139,auVar164);
      auVar99 = ZEXT416((uint)(fVar19 * fVar63 - fVar61 * fVar64));
      auVar83 = vshufps_avx(auVar99,auVar99,0);
      auVar99 = ZEXT416((uint)(fVar61 * fVar143 - fVar19 * fVar62));
      auVar58 = vshufps_avx(auVar99,auVar99,0);
      auVar122 = vpermilps_avx(ZEXT416((uint)(fVar64 * fVar62 - fVar63 * fVar143)),0);
      auVar140._0_4_ = auVar122._0_4_ * fVar17 + auVar83._0_4_ * fVar9 + auVar58._0_4_ * fVar13;
      auVar140._4_4_ = auVar122._4_4_ * fVar18 + auVar83._4_4_ * fVar10 + auVar58._4_4_ * fVar14;
      auVar140._8_4_ = auVar122._8_4_ * fVar20 + auVar83._8_4_ * fVar11 + auVar58._8_4_ * fVar15;
      auVar140._12_4_ = auVar122._12_4_ * fVar21 + auVar83._12_4_ * fVar12 + auVar58._12_4_ * fVar16
      ;
      auVar57 = vshufps_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62),0);
      auVar95 = vshufps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0);
      auVar104 = vshufps_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61),0);
      auVar73._8_4_ = 0x80000000;
      auVar73._0_8_ = 0x8000000080000000;
      auVar73._12_4_ = 0x80000000;
      auVar99 = vandps_avx(auVar140,auVar73);
      uVar144 = auVar99._0_4_;
      auVar97._0_4_ =
           (float)(uVar144 ^
                  (uint)(auVar104._0_4_ * auVar112._0_4_ +
                        auVar113._0_4_ * auVar57._0_4_ + auVar114._0_4_ * auVar95._0_4_));
      uVar147 = auVar99._4_4_;
      auVar97._4_4_ =
           (float)(uVar147 ^
                  (uint)(auVar104._4_4_ * auVar112._4_4_ +
                        auVar113._4_4_ * auVar57._4_4_ + auVar114._4_4_ * auVar95._4_4_));
      uVar149 = auVar99._8_4_;
      auVar97._8_4_ =
           (float)(uVar149 ^
                  (uint)(auVar104._8_4_ * auVar112._8_4_ +
                        auVar113._8_4_ * auVar57._8_4_ + auVar114._8_4_ * auVar95._8_4_));
      uVar151 = auVar99._12_4_;
      auVar97._12_4_ =
           (float)(uVar151 ^
                  (uint)(auVar104._12_4_ * auVar112._12_4_ +
                        auVar113._12_4_ * auVar57._12_4_ + auVar114._12_4_ * auVar95._12_4_));
      auVar99 = vcmpps_avx(auVar97,_DAT_01f7aa10,5);
      auVar57 = auVar50 & auVar99;
      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar57[0xf] < '\0'
         ) {
        auVar95 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
        auVar104 = vpermilps_avx(ZEXT416((uint)fVar143),0);
        auVar123 = vpermilps_avx(ZEXT416((uint)fVar64),0);
        auVar57 = vandps_avx(auVar99,auVar50);
        auVar105._0_4_ =
             (float)(uVar144 ^
                    (uint)(auVar95._0_4_ * auVar112._0_4_ +
                          auVar113._0_4_ * auVar104._0_4_ + auVar114._0_4_ * auVar123._0_4_));
        auVar105._4_4_ =
             (float)(uVar147 ^
                    (uint)(auVar95._4_4_ * auVar112._4_4_ +
                          auVar113._4_4_ * auVar104._4_4_ + auVar114._4_4_ * auVar123._4_4_));
        auVar105._8_4_ =
             (float)(uVar149 ^
                    (uint)(auVar95._8_4_ * auVar112._8_4_ +
                          auVar113._8_4_ * auVar104._8_4_ + auVar114._8_4_ * auVar123._8_4_));
        auVar105._12_4_ =
             (float)(uVar151 ^
                    (uint)(auVar95._12_4_ * auVar112._12_4_ +
                          auVar113._12_4_ * auVar104._12_4_ + auVar114._12_4_ * auVar123._12_4_));
        auVar99 = vcmpps_avx(auVar105,_DAT_01f7aa10,5);
        auVar95 = auVar57 & auVar99;
        if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar95[0xf] < '\0') {
          auVar51._8_4_ = 0x7fffffff;
          auVar51._0_8_ = 0x7fffffff7fffffff;
          auVar51._12_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar140,auVar51);
          auVar57 = vandps_avx(auVar99,auVar57);
          auVar99 = vsubps_avx(auVar95,auVar97);
          auVar99 = vcmpps_avx(auVar99,auVar105,5);
          auVar104 = auVar57 & auVar99;
          if ((((auVar104 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar104[0xf] < '\0') {
            auVar99 = vandps_avx(auVar99,auVar57);
            auVar116._0_4_ =
                 (float)(uVar144 ^
                        (uint)(auVar122._0_4_ * fVar103 +
                              auVar83._0_4_ * fVar121 + fVar130 * auVar58._0_4_));
            auVar116._4_4_ =
                 (float)(uVar147 ^
                        (uint)(auVar122._4_4_ * fVar108 +
                              auVar83._4_4_ * fVar126 + fVar134 * auVar58._4_4_));
            auVar116._8_4_ =
                 (float)(uVar149 ^
                        (uint)(auVar122._8_4_ * fVar109 +
                              auVar83._8_4_ * fVar127 + fVar111 * auVar58._8_4_));
            auVar116._12_4_ =
                 (float)(uVar151 ^
                        (uint)(auVar122._12_4_ * fVar110 +
                              auVar83._12_4_ * fVar128 + fVar118 * auVar58._12_4_));
            fVar61 = auVar95._0_4_;
            auVar52._0_4_ = fVar61 * *(float *)(ray + 0x30);
            fVar62 = auVar95._4_4_;
            auVar52._4_4_ = fVar62 * *(float *)(ray + 0x34);
            fVar63 = auVar95._8_4_;
            auVar52._8_4_ = fVar63 * *(float *)(ray + 0x38);
            fVar143 = auVar95._12_4_;
            auVar52._12_4_ = fVar143 * *(float *)(ray + 0x3c);
            auVar57 = vcmpps_avx(auVar52,auVar116,1);
            pRVar2 = ray + 0x80;
            auVar112 = *(undefined1 (*) [16])pRVar2;
            auVar77._0_4_ = fVar61 * *(float *)pRVar2;
            auVar77._4_4_ = fVar62 * *(float *)(ray + 0x84);
            auVar77._8_4_ = fVar63 * *(float *)(ray + 0x88);
            auVar77._12_4_ = fVar143 * *(float *)(ray + 0x8c);
            auVar104 = vcmpps_avx(auVar116,auVar77,2);
            auVar57 = vandps_avx(auVar104,auVar57);
            auVar104 = auVar99 & auVar57;
            if ((((auVar104 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar104[0xf] < '\0') {
              auVar57 = vandps_avx(auVar99,auVar57);
              auVar104 = vcmpps_avx(auVar140,_DAT_01f7aa10,4);
              auVar113 = auVar57 & auVar104;
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar113[0xf] < '\0') {
                auVar57 = vandps_avx(auVar104,auVar57);
                pGVar5 = (context->scene->geometries).items[uVar35].ptr;
                uVar144 = pGVar5->mask;
                auVar78._4_4_ = uVar144;
                auVar78._0_4_ = uVar144;
                auVar78._8_4_ = uVar144;
                auVar78._12_4_ = uVar144;
                auVar104 = vandps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x90));
                auVar104 = vpcmpeqd_avx(auVar104,_DAT_01f7aa10);
                auVar113 = auVar57 & ~auVar104;
                if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar113[0xf] < '\0') {
                  auVar57 = vandnps_avx(auVar104,auVar57);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar95 = vrcpps_avx(auVar95);
                    fVar64 = auVar95._0_4_;
                    auVar124._0_4_ = fVar61 * fVar64;
                    fVar61 = auVar95._4_4_;
                    auVar124._4_4_ = fVar62 * fVar61;
                    fVar62 = auVar95._8_4_;
                    auVar124._8_4_ = fVar63 * fVar62;
                    fVar63 = auVar95._12_4_;
                    auVar124._12_4_ = fVar143 * fVar63;
                    auVar133._8_4_ = 0x3f800000;
                    auVar133._0_8_ = 0x3f8000003f800000;
                    auVar133._12_4_ = 0x3f800000;
                    auVar95 = vsubps_avx(auVar133,auVar124);
                    fVar64 = fVar64 + fVar64 * auVar95._0_4_;
                    fVar61 = fVar61 + fVar61 * auVar95._4_4_;
                    fVar62 = fVar62 + fVar62 * auVar95._8_4_;
                    fVar63 = fVar63 + fVar63 * auVar95._12_4_;
                    auVar102._0_4_ = fVar64 * auVar97._0_4_;
                    auVar102._4_4_ = fVar61 * auVar97._4_4_;
                    auVar102._8_4_ = fVar62 * auVar97._8_4_;
                    auVar102._12_4_ = fVar63 * auVar97._12_4_;
                    auVar95 = vminps_avx(auVar102,auVar133);
                    auVar107._0_4_ = fVar64 * auVar105._0_4_;
                    auVar107._4_4_ = fVar61 * auVar105._4_4_;
                    auVar107._8_4_ = fVar62 * auVar105._8_4_;
                    auVar107._12_4_ = fVar63 * auVar105._12_4_;
                    auVar104 = vminps_avx(auVar107,auVar133);
                    auVar113 = vsubps_avx(auVar133,auVar95);
                    auVar114 = vsubps_avx(auVar133,auVar104);
                    auVar26._8_8_ = uVar32;
                    auVar26._0_8_ = uVar31;
                    local_1888 = vblendvps_avx(auVar95,auVar113,auVar26);
                    local_1878 = vblendvps_avx(auVar104,auVar114,auVar26);
                    local_1858 = vpshufd_avx(ZEXT416(uVar35),0);
                    local_1868 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18c8 + uVar40 * 4)),0);
                    local_18b8[0] = (RTCHitN)auVar122[0];
                    local_18b8[1] = (RTCHitN)auVar122[1];
                    local_18b8[2] = (RTCHitN)auVar122[2];
                    local_18b8[3] = (RTCHitN)auVar122[3];
                    local_18b8[4] = (RTCHitN)auVar122[4];
                    local_18b8[5] = (RTCHitN)auVar122[5];
                    local_18b8[6] = (RTCHitN)auVar122[6];
                    local_18b8[7] = (RTCHitN)auVar122[7];
                    local_18b8[8] = (RTCHitN)auVar122[8];
                    local_18b8[9] = (RTCHitN)auVar122[9];
                    local_18b8[10] = (RTCHitN)auVar122[10];
                    local_18b8[0xb] = (RTCHitN)auVar122[0xb];
                    local_18b8[0xc] = (RTCHitN)auVar122[0xc];
                    local_18b8[0xd] = (RTCHitN)auVar122[0xd];
                    local_18b8[0xe] = (RTCHitN)auVar122[0xe];
                    local_18b8[0xf] = (RTCHitN)auVar122[0xf];
                    local_18a8 = auVar83;
                    local_1898 = auVar58;
                    auVar80._0_4_ = fVar64 * auVar116._0_4_;
                    auVar80._4_4_ = fVar61 * auVar116._4_4_;
                    auVar80._8_4_ = fVar62 * auVar116._8_4_;
                    auVar80._12_4_ = fVar63 * auVar116._12_4_;
                    vcmpps_avx(ZEXT1632(auVar58),ZEXT1632(auVar58),0xf);
                    uStack_1844 = context->user->instID[0];
                    local_1848 = uStack_1844;
                    uStack_1840 = uStack_1844;
                    uStack_183c = uStack_1844;
                    uStack_1838 = context->user->instPrimID[0];
                    uStack_1834 = uStack_1838;
                    uStack_1830 = uStack_1838;
                    uStack_182c = uStack_1838;
                    auVar83 = vblendvps_avx(*(undefined1 (*) [16])pRVar2,auVar80,auVar57);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar83;
                    args.valid = (int *)local_19a8;
                    args.geometryUserPtr = pGVar5->userPtr;
                    args.context = context->user;
                    args.hit = local_18b8;
                    args.N = 4;
                    local_19a8 = auVar57;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar5->occlusionFilterN)(&args);
                    }
                    if (local_19a8 == (undefined1  [16])0x0) {
                      auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar83 = auVar83 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&args);
                      }
                      auVar58 = vpcmpeqd_avx(local_19a8,_DAT_01f7aa10);
                      auVar83 = auVar58 ^ _DAT_01f7ae20;
                      auVar90._8_4_ = 0xff800000;
                      auVar90._0_8_ = 0xff800000ff800000;
                      auVar90._12_4_ = 0xff800000;
                      auVar58 = vblendvps_avx(auVar90,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar58);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar58;
                    }
                    auVar83 = vpslld_avx(auVar83,0x1f);
                    auVar57 = vpsrad_avx(auVar83,0x1f);
                    auVar83 = vblendvps_avx(auVar112,*(undefined1 (*) [16])pRVar1,auVar83);
                    *(undefined1 (*) [16])pRVar1 = auVar83;
                  }
                  auVar50 = vpandn_avx(auVar57,auVar50);
                }
              }
            }
          }
        }
      }
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
      {
        auVar146 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar99 = vpcmpeqd_avx(auVar99,auVar99);
        auVar154 = ZEXT1664(auVar99);
        break;
      }
      auVar29._4_4_ = fVar47;
      auVar29._0_4_ = fVar47;
      auVar29._8_4_ = fVar47;
      auVar29._12_4_ = fVar47;
      auVar58 = vsubps_avx(local_1928,auVar29);
      auVar28._4_4_ = fVar3;
      auVar28._0_4_ = fVar3;
      auVar28._8_4_ = fVar3;
      auVar28._12_4_ = fVar3;
      auVar99 = vsubps_avx(local_1938,auVar28);
      auVar22._4_4_ = uVar36;
      auVar22._0_4_ = uVar36;
      auVar22._8_4_ = uVar36;
      auVar22._12_4_ = uVar36;
      auVar27._4_4_ = fVar4;
      auVar27._0_4_ = fVar4;
      auVar27._8_4_ = fVar4;
      auVar27._12_4_ = fVar4;
      auVar83 = vsubps_avx(auVar22,auVar27);
      auVar57 = vsubps_avx(_local_1998,local_1928);
      auVar95 = vsubps_avx(_local_1918,local_1938);
      auVar30._4_4_ = fVar129;
      auVar30._0_4_ = fVar129;
      auVar30._8_4_ = fVar129;
      auVar30._12_4_ = fVar129;
      auVar104 = vsubps_avx(auVar30,auVar22);
      fVar61 = auVar99._0_4_;
      fVar161 = auVar104._0_4_;
      auVar49._0_4_ = fVar161 * fVar61;
      fVar3 = auVar99._4_4_;
      fVar165 = auVar104._4_4_;
      auVar49._4_4_ = fVar165 * fVar3;
      fVar9 = auVar99._8_4_;
      fVar166 = auVar104._8_4_;
      auVar49._8_4_ = fVar166 * fVar9;
      fVar14 = auVar99._12_4_;
      fVar167 = auVar104._12_4_;
      auVar49._12_4_ = fVar167 * fVar14;
      fVar62 = auVar83._0_4_;
      fVar145 = auVar95._0_4_;
      auVar74._0_4_ = fVar145 * fVar62;
      fVar4 = auVar83._4_4_;
      fVar148 = auVar95._4_4_;
      auVar74._4_4_ = fVar148 * fVar4;
      fVar10 = auVar83._8_4_;
      fVar150 = auVar95._8_4_;
      auVar74._8_4_ = fVar150 * fVar10;
      fVar15 = auVar83._12_4_;
      fVar152 = auVar95._12_4_;
      auVar74._12_4_ = fVar152 * fVar15;
      auVar95 = vsubps_avx(auVar74,auVar49);
      fVar63 = auVar57._0_4_;
      auVar75._0_4_ = fVar62 * fVar63;
      fVar143 = auVar57._4_4_;
      auVar75._4_4_ = fVar4 * fVar143;
      fVar11 = auVar57._8_4_;
      auVar75._8_4_ = fVar10 * fVar11;
      fVar16 = auVar57._12_4_;
      auVar75._12_4_ = fVar15 * fVar16;
      fVar129 = auVar58._0_4_;
      auVar87._0_4_ = fVar161 * fVar129;
      fVar64 = auVar58._4_4_;
      auVar87._4_4_ = fVar165 * fVar64;
      fVar12 = auVar58._8_4_;
      auVar87._8_4_ = fVar166 * fVar12;
      fVar17 = auVar58._12_4_;
      auVar87._12_4_ = fVar167 * fVar17;
      auVar57 = vsubps_avx(auVar87,auVar75);
      auVar88._0_4_ = fVar145 * fVar129;
      auVar88._4_4_ = fVar148 * fVar64;
      auVar88._8_4_ = fVar150 * fVar12;
      auVar88._12_4_ = fVar152 * fVar17;
      auVar98._0_4_ = fVar63 * fVar61;
      auVar98._4_4_ = fVar143 * fVar3;
      auVar98._8_4_ = fVar11 * fVar9;
      auVar98._12_4_ = fVar16 * fVar14;
      auVar104 = vsubps_avx(auVar98,auVar88);
      auVar99 = vsubps_avx(local_1928,*(undefined1 (*) [16])ray);
      auVar83 = vsubps_avx(local_1938,*(undefined1 (*) [16])(ray + 0x10));
      auVar112 = vsubps_avx(auVar22,*(undefined1 (*) [16])(ray + 0x20));
      fVar20 = *(float *)(ray + 0x50);
      fVar21 = *(float *)(ray + 0x54);
      fVar103 = *(float *)(ray + 0x58);
      fVar108 = *(float *)(ray + 0x5c);
      fVar109 = *(float *)(ray + 0x60);
      fVar110 = *(float *)(ray + 100);
      fVar121 = *(float *)(ray + 0x68);
      fVar126 = *(float *)(ray + 0x6c);
      fVar47 = auVar112._0_4_;
      auVar153._0_4_ = fVar20 * fVar47;
      fVar19 = auVar112._4_4_;
      auVar153._4_4_ = fVar21 * fVar19;
      fVar13 = auVar112._8_4_;
      auVar153._8_4_ = fVar103 * fVar13;
      fVar18 = auVar112._12_4_;
      auVar153._12_4_ = fVar108 * fVar18;
      fVar131 = auVar83._0_4_;
      auVar155._0_4_ = fVar131 * fVar109;
      fVar135 = auVar83._4_4_;
      auVar155._4_4_ = fVar135 * fVar110;
      fVar136 = auVar83._8_4_;
      auVar155._8_4_ = fVar136 * fVar121;
      fVar137 = auVar83._12_4_;
      auVar155._12_4_ = fVar137 * fVar126;
      auVar83 = vsubps_avx(auVar155,auVar153);
      fVar127 = *(float *)(ray + 0x40);
      fVar128 = *(float *)(ray + 0x44);
      fVar130 = *(float *)(ray + 0x48);
      fVar134 = *(float *)(ray + 0x4c);
      fVar111 = auVar99._0_4_;
      auVar156._0_4_ = fVar111 * fVar109;
      fVar118 = auVar99._4_4_;
      auVar156._4_4_ = fVar118 * fVar110;
      fVar119 = auVar99._8_4_;
      auVar156._8_4_ = fVar119 * fVar121;
      fVar120 = auVar99._12_4_;
      auVar156._12_4_ = fVar120 * fVar126;
      auVar159._0_4_ = fVar47 * fVar127;
      auVar159._4_4_ = fVar19 * fVar128;
      auVar159._8_4_ = fVar13 * fVar130;
      auVar159._12_4_ = fVar18 * fVar134;
      auVar112 = vsubps_avx(auVar159,auVar156);
      auVar160._0_4_ = fVar131 * fVar127;
      auVar160._4_4_ = fVar135 * fVar128;
      auVar160._8_4_ = fVar136 * fVar130;
      auVar160._12_4_ = fVar137 * fVar134;
      auVar89._0_4_ = fVar20 * fVar111;
      auVar89._4_4_ = fVar21 * fVar118;
      auVar89._8_4_ = fVar103 * fVar119;
      auVar89._12_4_ = fVar108 * fVar120;
      auVar113 = vsubps_avx(auVar89,auVar160);
      auVar141._0_4_ = auVar95._0_4_ * fVar127 + fVar20 * auVar57._0_4_ + auVar104._0_4_ * fVar109;
      auVar141._4_4_ = auVar95._4_4_ * fVar128 + fVar21 * auVar57._4_4_ + auVar104._4_4_ * fVar110;
      auVar141._8_4_ = auVar95._8_4_ * fVar130 + fVar103 * auVar57._8_4_ + auVar104._8_4_ * fVar121;
      auVar141._12_4_ =
           auVar95._12_4_ * fVar134 + fVar108 * auVar57._12_4_ + auVar104._12_4_ * fVar126;
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar99 = vandps_avx(auVar141,auVar76);
      uVar35 = auVar99._0_4_;
      auVar101._0_4_ =
           (float)(uVar35 ^ (uint)(auVar83._0_4_ * fVar63 +
                                  fVar145 * auVar112._0_4_ + fVar161 * auVar113._0_4_));
      uVar144 = auVar99._4_4_;
      auVar101._4_4_ =
           (float)(uVar144 ^
                  (uint)(auVar83._4_4_ * fVar143 +
                        fVar148 * auVar112._4_4_ + fVar165 * auVar113._4_4_));
      uVar147 = auVar99._8_4_;
      auVar101._8_4_ =
           (float)(uVar147 ^
                  (uint)(auVar83._8_4_ * fVar11 +
                        fVar150 * auVar112._8_4_ + fVar166 * auVar113._8_4_));
      uVar149 = auVar99._12_4_;
      auVar101._12_4_ =
           (float)(uVar149 ^
                  (uint)(auVar83._12_4_ * fVar16 +
                        fVar152 * auVar112._12_4_ + fVar167 * auVar113._12_4_));
      auVar60 = ZEXT1664(auVar50);
      auVar99 = vcmpps_avx(auVar101,_DAT_01f7aa10,5);
      auVar114 = auVar50 & auVar99;
      _local_1998 = auVar58;
      if ((((auVar114 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar114 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar114 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar114[0xf] < '\0') {
        auVar99 = vandps_avx(auVar99,auVar50);
        auVar106._0_4_ =
             (float)(uVar35 ^ (uint)(auVar83._0_4_ * fVar129 +
                                    auVar112._0_4_ * fVar61 + fVar62 * auVar113._0_4_));
        auVar106._4_4_ =
             (float)(uVar144 ^
                    (uint)(auVar83._4_4_ * fVar64 + auVar112._4_4_ * fVar3 + fVar4 * auVar113._4_4_)
                    );
        auVar106._8_4_ =
             (float)(uVar147 ^
                    (uint)(auVar83._8_4_ * fVar12 + auVar112._8_4_ * fVar9 + fVar10 * auVar113._8_4_
                          ));
        auVar106._12_4_ =
             (float)(uVar149 ^
                    (uint)(auVar83._12_4_ * fVar17 +
                          auVar112._12_4_ * fVar14 + fVar15 * auVar113._12_4_));
        auVar58 = vcmpps_avx(auVar106,_DAT_01f7aa10,5);
        auVar112 = auVar99 & auVar58;
        if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar112[0xf] < '\0') {
          auVar53._8_4_ = 0x7fffffff;
          auVar53._0_8_ = 0x7fffffff7fffffff;
          auVar53._12_4_ = 0x7fffffff;
          auVar112 = vandps_avx(auVar141,auVar53);
          auVar99 = vandps_avx(auVar58,auVar99);
          auVar83 = vsubps_avx(auVar112,auVar101);
          auVar83 = vcmpps_avx(auVar83,auVar106,5);
          auVar58 = auVar99 & auVar83;
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar58[0xf] < '\0') {
            auVar99 = vandps_avx(auVar83,auVar99);
            auVar117._0_4_ =
                 (float)(uVar35 ^ (uint)(auVar95._0_4_ * fVar111 +
                                        fVar131 * auVar57._0_4_ + fVar47 * auVar104._0_4_));
            auVar117._4_4_ =
                 (float)(uVar144 ^
                        (uint)(auVar95._4_4_ * fVar118 +
                              fVar135 * auVar57._4_4_ + fVar19 * auVar104._4_4_));
            auVar117._8_4_ =
                 (float)(uVar147 ^
                        (uint)(auVar95._8_4_ * fVar119 +
                              fVar136 * auVar57._8_4_ + fVar13 * auVar104._8_4_));
            auVar117._12_4_ =
                 (float)(uVar149 ^
                        (uint)(auVar95._12_4_ * fVar120 +
                              fVar137 * auVar57._12_4_ + fVar18 * auVar104._12_4_));
            fVar61 = auVar112._0_4_;
            auVar54._0_4_ = fVar61 * *(float *)(ray + 0x30);
            fVar62 = auVar112._4_4_;
            auVar54._4_4_ = fVar62 * *(float *)(ray + 0x34);
            fVar63 = auVar112._8_4_;
            auVar54._8_4_ = fVar63 * *(float *)(ray + 0x38);
            fVar129 = auVar112._12_4_;
            auVar54._12_4_ = fVar129 * *(float *)(ray + 0x3c);
            auVar58 = vcmpps_avx(auVar54,auVar117,1);
            _local_1998 = *(undefined1 (*) [16])(ray + 0x80);
            auVar79._0_4_ = fVar61 * *(float *)(ray + 0x80);
            auVar79._4_4_ = fVar62 * *(float *)(ray + 0x84);
            auVar79._8_4_ = fVar63 * *(float *)(ray + 0x88);
            auVar79._12_4_ = fVar129 * *(float *)(ray + 0x8c);
            auVar113 = vcmpps_avx(auVar117,auVar79,2);
            auVar58 = vandps_avx(auVar113,auVar58);
            auVar113 = auVar99 & auVar58;
            if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar113[0xf] < '\0') {
              auVar99 = vandps_avx(auVar99,auVar58);
              auVar58 = vcmpps_avx(auVar141,_DAT_01f7aa10,4);
              auVar113 = auVar99 & auVar58;
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar113[0xf] < '\0') {
                auVar99 = vandps_avx(auVar58,auVar99);
                uVar144 = *(uint *)(lVar39 + uVar40 * 4);
                pGVar5 = (context->scene->geometries).items[uVar144].ptr;
                uVar35 = pGVar5->mask;
                auVar55._4_4_ = uVar35;
                auVar55._0_4_ = uVar35;
                auVar55._8_4_ = uVar35;
                auVar55._12_4_ = uVar35;
                auVar58 = vandps_avx(auVar55,*(undefined1 (*) [16])(ray + 0x90));
                auVar58 = vpcmpeqd_avx(auVar58,_DAT_01f7aa10);
                auVar113 = auVar99 & ~auVar58;
                if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar113[0xf] < '\0') {
                  auVar99 = vandnps_avx(auVar58,auVar99);
                  auVar83 = auVar95;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar58 = vrcpps_avx(auVar112);
                    fVar47 = auVar58._0_4_;
                    auVar81._0_4_ = fVar61 * fVar47;
                    fVar61 = auVar58._4_4_;
                    auVar81._4_4_ = fVar62 * fVar61;
                    fVar62 = auVar58._8_4_;
                    auVar81._8_4_ = fVar63 * fVar62;
                    fVar63 = auVar58._12_4_;
                    auVar81._12_4_ = fVar129 * fVar63;
                    auVar125._8_4_ = 0x3f800000;
                    auVar125._0_8_ = 0x3f8000003f800000;
                    auVar125._12_4_ = 0x3f800000;
                    auVar58 = vsubps_avx(auVar125,auVar81);
                    fVar47 = fVar47 + fVar47 * auVar58._0_4_;
                    fVar61 = fVar61 + fVar61 * auVar58._4_4_;
                    fVar62 = fVar62 + fVar62 * auVar58._8_4_;
                    fVar63 = fVar63 + fVar63 * auVar58._12_4_;
                    auVar82._0_4_ = fVar47 * auVar101._0_4_;
                    auVar82._4_4_ = fVar61 * auVar101._4_4_;
                    auVar82._8_4_ = fVar62 * auVar101._8_4_;
                    auVar82._12_4_ = fVar63 * auVar101._12_4_;
                    auVar58 = vminps_avx(auVar82,auVar125);
                    auVar91._0_4_ = fVar47 * auVar106._0_4_;
                    auVar91._4_4_ = fVar61 * auVar106._4_4_;
                    auVar91._8_4_ = fVar62 * auVar106._8_4_;
                    auVar91._12_4_ = fVar63 * auVar106._12_4_;
                    auVar112 = vminps_avx(auVar91,auVar125);
                    auVar113 = vsubps_avx(auVar125,auVar58);
                    auVar114 = vsubps_avx(auVar125,auVar112);
                    auVar25._8_8_ = uVar34;
                    auVar25._0_8_ = uVar33;
                    local_1888 = vblendvps_avx(auVar58,auVar113,auVar25);
                    local_1878 = vblendvps_avx(auVar112,auVar114,auVar25);
                    local_1858 = vpshufd_avx(ZEXT416(uVar144),0);
                    local_1868 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18c8 + uVar40 * 4)),0);
                    local_18b8[0] = (RTCHitN)auVar95[0];
                    local_18b8[1] = (RTCHitN)auVar95[1];
                    local_18b8[2] = (RTCHitN)auVar95[2];
                    local_18b8[3] = (RTCHitN)auVar95[3];
                    local_18b8[4] = (RTCHitN)auVar95[4];
                    local_18b8[5] = (RTCHitN)auVar95[5];
                    local_18b8[6] = (RTCHitN)auVar95[6];
                    local_18b8[7] = (RTCHitN)auVar95[7];
                    local_18b8[8] = (RTCHitN)auVar95[8];
                    local_18b8[9] = (RTCHitN)auVar95[9];
                    local_18b8[10] = (RTCHitN)auVar95[10];
                    local_18b8[0xb] = (RTCHitN)auVar95[0xb];
                    local_18b8[0xc] = (RTCHitN)auVar95[0xc];
                    local_18b8[0xd] = (RTCHitN)auVar95[0xd];
                    local_18b8[0xe] = (RTCHitN)auVar95[0xe];
                    local_18b8[0xf] = (RTCHitN)auVar95[0xf];
                    local_18a8 = auVar57;
                    local_1898 = auVar104;
                    auVar56._0_4_ = fVar47 * auVar117._0_4_;
                    auVar56._4_4_ = fVar61 * auVar117._4_4_;
                    auVar56._8_4_ = fVar62 * auVar117._8_4_;
                    auVar56._12_4_ = fVar63 * auVar117._12_4_;
                    vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
                    uStack_1844 = context->user->instID[0];
                    local_1848 = uStack_1844;
                    uStack_1840 = uStack_1844;
                    uStack_183c = uStack_1844;
                    uStack_1838 = context->user->instPrimID[0];
                    uStack_1834 = uStack_1838;
                    uStack_1830 = uStack_1838;
                    uStack_182c = uStack_1838;
                    auVar58 = vblendvps_avx(_local_1998,auVar56,auVar99);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar58;
                    args.valid = (int *)local_19a8;
                    args.geometryUserPtr = pGVar5->userPtr;
                    args.context = context->user;
                    args.hit = local_18b8;
                    args.N = 4;
                    local_19a8 = auVar99;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar5->occlusionFilterN)(&args);
                    }
                    if (local_19a8 == (undefined1  [16])0x0) {
                      auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar99 = auVar99 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&args);
                      }
                      auVar58 = vpcmpeqd_avx(local_19a8,_DAT_01f7aa10);
                      auVar99 = auVar58 ^ _DAT_01f7ae20;
                      auVar92._8_4_ = 0xff800000;
                      auVar92._0_8_ = 0xff800000ff800000;
                      auVar92._12_4_ = 0xff800000;
                      auVar58 = vblendvps_avx(auVar92,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar58);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar58;
                    }
                    auVar58 = vpslld_avx(auVar99,0x1f);
                    auVar99 = vpsrad_avx(auVar58,0x1f);
                    auVar58 = vblendvps_avx(_local_1998,*(undefined1 (*) [16])pRVar1,auVar58);
                    *(undefined1 (*) [16])pRVar1 = auVar58;
                  }
                  auVar50 = vpandn_avx(auVar99,auVar50);
                  auVar60 = ZEXT1664(auVar50);
                  goto LAB_002f8222;
                }
              }
            }
          }
        }
        auVar60 = ZEXT1664(auVar50);
      }
LAB_002f8222:
      auVar50 = auVar60._0_16_;
      auVar146 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar99 = vpcmpeqd_avx(auVar83,auVar83);
      auVar154 = ZEXT1664(auVar99);
      if (((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
         || (bVar46 = 2 < uVar40, uVar40 = uVar40 + 1, bVar46)) break;
    }
    auVar99 = vpand_avx(auVar50,auVar94);
    auVar94 = auVar94 & auVar50;
    if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar94[0xf])
    break;
  }
  aVar59 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar154._0_16_ ^ auVar99);
LAB_002f8ac6:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar59);
  auVar94 = auVar154._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar94[0xf])
  goto LAB_002f8bdc;
  auVar93._8_4_ = 0xff800000;
  auVar93._0_8_ = 0xff800000ff800000;
  auVar93._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar93,
                     (undefined1  [16])terminated.field_0);
  goto LAB_002f7c8d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }